

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wrank(OutputFile *this,rule_rank_t r)

{
  ostream *o;
  OutputFile *this_local;
  rule_rank_t r_local;
  
  o = stream(this);
  operator<<(o,r);
  return this;
}

Assistant:

OutputFile & OutputFile::wrank (rule_rank_t r)
{
	stream () << r;
	return *this;
}